

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools_merge.cpp
# Opt level: O3

void __thiscall BamTools::MergeTool::~MergeTool(MergeTool *this)

{
  MergeSettings *pMVar1;
  pointer pcVar2;
  
  (this->super_AbstractTool)._vptr_AbstractTool = (_func_int **)&PTR__MergeTool_001f1110;
  pMVar1 = this->m_settings;
  if (pMVar1 != (MergeSettings *)0x0) {
    pcVar2 = (pMVar1->Region)._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar2 != &(pMVar1->Region).field_2) {
      operator_delete(pcVar2);
    }
    pcVar2 = (pMVar1->OutputFilename)._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar2 != &(pMVar1->OutputFilename).field_2) {
      operator_delete(pcVar2);
    }
    pcVar2 = (pMVar1->InputFilelist)._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar2 != &(pMVar1->InputFilelist).field_2) {
      operator_delete(pcVar2);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&pMVar1->InputFiles);
  }
  operator_delete(pMVar1);
  this->m_settings = (MergeSettings *)0x0;
  operator_delete(this->m_impl);
  this->m_impl = (MergeToolPrivate *)0x0;
  return;
}

Assistant:

MergeTool::~MergeTool()
{

    delete m_settings;
    m_settings = 0;

    delete m_impl;
    m_impl = 0;
}